

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract.cpp
# Opt level: O3

void jbcoin::LogThrow(string *title)

{
  int iVar1;
  Sink *pSVar2;
  Stream local_1a8;
  ScopedStream local_198;
  
  debugSink();
  pSVar2 = DebugSink::get(&debugSink::_);
  iVar1 = (*pSVar2->_vptr_Sink[2])(pSVar2,3);
  if ((char)iVar1 != '\0') {
    debugSink();
    local_1a8.m_sink = DebugSink::get(&debugSink::_);
    local_1a8.m_level = kWarning;
    beast::Journal::ScopedStream::ScopedStream<std::__cxx11::string>(&local_198,&local_1a8,title);
    beast::Journal::ScopedStream::~ScopedStream(&local_198);
  }
  return;
}

Assistant:

void
LogThrow (std::string const& title)
{
    JLOG(debugLog().warn()) << title;
}